

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

string * __thiscall DataRefs::CSLPathCfgTy::operator=(CSLPathCfgTy *this,string *_p)

{
  bool bVar1;
  string local_38;
  
  LTRemoveXPSystemPath(&local_38,_p);
  std::__cxx11::string::operator=((string *)&this->path,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  bVar1 = exists(this);
  this->bPathExists = (uint)bVar1;
  return &this->path;
}

Assistant:

const std::string& DataRefs::CSLPathCfgTy::operator= (const std::string& _p)
{
    path = LTRemoveXPSystemPath(_p);        // store (shortened) path
    existsSave();                           // check for existence
    return path;
}